

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O1

void hiberlite::hibernate<hiberlite::AVisitor<hiberlite::KillChildren>,int,double>
               (AVisitor<hiberlite::KillChildren> *ar,pair<int,_double> *m,uint param_3)

{
  sql_nvp<double> s;
  sql_nvp<int> f;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  undefined1 local_140 [40];
  _Alloc_hider local_118;
  char local_108 [16];
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  char local_c0 [16];
  sql_nvp<double> local_b0;
  sql_nvp<int> local_68;
  
  local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"first","");
  local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_180,"");
  sql_nvp<int>::sql_nvp(&local_68,&local_160,&m->first,&local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_dataplus._M_p != &local_180.field_2) {
    operator_delete(local_180._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p);
  }
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,"second","");
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"");
  sql_nvp<double>::sql_nvp(&local_b0,&local_1a0,&m->second,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p);
  }
  local_f8._0_8_ = local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_f8,local_68.name._M_dataplus._M_p,
             local_68.name._M_dataplus._M_p + local_68.name._M_string_length);
  local_f8._32_8_ = local_68.value;
  local_d0._M_p = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,local_68.search_key._M_dataplus._M_p,
             local_68.search_key._M_dataplus._M_p + local_68.search_key._M_string_length);
  AVisitor<hiberlite::KillChildren>::operator&(ar,(sql_nvp<int> *)local_f8);
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_);
  }
  local_140._0_8_ = local_140 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_140,local_b0.name._M_dataplus._M_p,
             local_b0.name._M_dataplus._M_p + local_b0.name._M_string_length);
  local_140._32_8_ = local_b0.value;
  local_118._M_p = local_108;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_118,local_b0.search_key._M_dataplus._M_p,
             local_b0.search_key._M_dataplus._M_p + local_b0.search_key._M_string_length);
  AVisitor<hiberlite::KillChildren>::operator&(ar,(sql_nvp<double> *)local_140);
  if (local_118._M_p != local_108) {
    operator_delete(local_118._M_p);
  }
  if ((undefined1 *)local_140._0_8_ != local_140 + 0x10) {
    operator_delete((void *)local_140._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.search_key._M_dataplus._M_p != &local_b0.search_key.field_2) {
    operator_delete(local_b0.search_key._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.name._M_dataplus._M_p != &local_b0.name.field_2) {
    operator_delete(local_b0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.search_key._M_dataplus._M_p != &local_68.search_key.field_2) {
    operator_delete(local_68.search_key._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void hibernate(A& ar, std::pair<First,Second>& m, const unsigned int)
{
	sql_nvp<First> f("first", m.first);
	sql_nvp<Second> s("second", m.second);
	ar & f;
	ar & s;
}